

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_square_matrix.h
# Opt level: O0

void __thiscall
sparse_square_matrix<unsigned_char>::recreate(sparse_square_matrix<unsigned_char> *this,uint32_t n)

{
  uint32_t n_local;
  sparse_square_matrix<unsigned_char> *this_local;
  
  this->N = n;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->denseStorage);
  std::
  unordered_map<unsigned_long,_unsigned_char,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_char>_>_>
  ::clear(&this->sparseStorage);
  if (this->N < 0x2000) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->denseStorage,(ulong)(this->N * this->N));
  }
  return;
}

Assistant:

void recreate(uint32_t n) {
    N = n;
    denseStorage.clear();
    sparseStorage.clear();
    if (N < DenseLimit) {
      denseStorage.resize(N * N);
    }
  }